

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_indexer.hpp
# Opt level: O0

void set_reference_points<IsoForest,double,unsigned_long>
               (TreesIndexer *indexer,IsoForest *model,bool with_distances,double *numeric_data,
               int *categ_data,bool is_col_major,size_t ld_numeric,size_t ld_categ,double *Xc,
               unsigned_long *Xc_ind,unsigned_long *Xc_indptr,double *Xr,unsigned_long *Xr_ind,
               unsigned_long *Xr_indptr,size_t nrows,int nthreads)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  byte bVar3;
  bool bVar4;
  uint uVar5;
  size_t sVar6;
  ulong uVar7;
  SingleTreeIndex *in_RCX;
  byte in_DL;
  double *in_RSI;
  vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_> *in_RDI;
  TreesIndexer *in_R8;
  byte in_R9B;
  undefined8 in_stack_00000010;
  int *in_stack_00000018;
  nullptr_t in_stack_00000020;
  unique_ptr<double[],_std::default_delete<double[]>_> *in_stack_00000028;
  unsigned_long *in_stack_00000030;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_00000038;
  ulong in_stack_00000048;
  size_t tree_1;
  void *model_ext_ptr;
  void *model_ptr;
  unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_> node_indices_predict;
  unique_ptr<double[],_std::default_delete<double[]>_> ignored;
  size_t ntrees;
  SingleTreeIndex *tree;
  iterator __end2;
  iterator __begin2;
  vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_> *__range2;
  vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_> *in_stack_fffffffffffffe38;
  vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_> *in_stack_fffffffffffffe40;
  vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_> *in_stack_fffffffffffffe50;
  undefined8 in_stack_fffffffffffffea0;
  IsoForest *in_stack_fffffffffffffea8;
  TreesIndexer *in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffed8;
  size_t *in_stack_ffffffffffffff40;
  size_t *Xc_indptr_00;
  size_t *in_stack_ffffffffffffff58;
  size_t *in_stack_ffffffffffffff60;
  size_t in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff70;
  reference in_stack_ffffffffffffff80;
  iterator in_stack_ffffffffffffff88;
  iterator in_stack_ffffffffffffff90;
  vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_> *in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffa0;
  TreesIndexer *indexer_00;
  
  bVar3 = in_R9B & 1;
  bVar4 = std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>::empty
                    (in_stack_fffffffffffffe50);
  if (!bVar4) {
    if ((in_DL & 1) == 0) goto LAB_00444eb9;
    std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>::front(in_stack_fffffffffffffe40)
    ;
    bVar4 = std::vector<double,_std::allocator<double>_>::empty
                      ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe50);
    if (!bVar4) goto LAB_00444eb9;
  }
  build_tree_indices(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                     (int)((ulong)in_stack_fffffffffffffea0 >> 0x20),
                     SUB81((ulong)in_stack_fffffffffffffea0 >> 0x18,0));
LAB_00444eb9:
  std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>::front(in_stack_fffffffffffffe40);
  bVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     in_stack_fffffffffffffe50);
  if (!bVar4) {
    in_stack_ffffffffffffff98 = in_RDI;
    in_stack_ffffffffffffff90 =
         std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>::begin
                   (in_stack_fffffffffffffe38);
    in_stack_ffffffffffffff88 =
         std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>::end
                   (in_stack_fffffffffffffe38);
    while (bVar4 = __gnu_cxx::operator!=
                             ((__normal_iterator<SingleTreeIndex_*,_std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>_>
                               *)in_stack_fffffffffffffe40,
                              (__normal_iterator<SingleTreeIndex_*,_std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>_>
                               *)in_stack_fffffffffffffe38), bVar4) {
      in_stack_ffffffffffffff80 =
           __gnu_cxx::
           __normal_iterator<SingleTreeIndex_*,_std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>_>
           ::operator*((__normal_iterator<SingleTreeIndex_*,_std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>_>
                        *)&stack0xffffffffffffff90);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::clear
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x444f55);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::clear
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x444f66);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::clear
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x444f77);
      __gnu_cxx::
      __normal_iterator<SingleTreeIndex_*,_std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>_>
      ::operator++((__normal_iterator<SingleTreeIndex_*,_std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>_>
                    *)&stack0xffffffffffffff90);
    }
  }
  sVar6 = get_ntrees((IsoForest *)0x444f95);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = in_stack_00000048;
  uVar7 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar7 = 0xffffffffffffffff;
  }
  operator_new__(uVar7);
  std::unique_ptr<double[],std::default_delete<double[]>>::
  unique_ptr<double*,std::default_delete<double[]>,void,bool>
            ((unique_ptr<double[],_std::default_delete<double[]>_> *)in_stack_fffffffffffffe40,
             (double *)in_stack_fffffffffffffe38);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = in_stack_00000048 * sVar6;
  uVar7 = SUB168(auVar2 * ZEXT816(8),0);
  if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
    uVar7 = 0xffffffffffffffff;
  }
  operator_new__(uVar7);
  std::unique_ptr<unsigned_long[],std::default_delete<unsigned_long[]>>::
  unique_ptr<unsigned_long*,std::default_delete<unsigned_long[]>,void,bool>
            ((unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_> *)
             in_stack_fffffffffffffe40,(unsigned_long *)in_stack_fffffffffffffe38);
  Xc_indptr_00 = (size_t *)0x0;
  uVar5 = (uint)bVar3;
  indexer_00 = in_R8;
  std::unique_ptr<double[],_std::default_delete<double[]>_>::get
            ((unique_ptr<double[],_std::default_delete<double[]>_> *)in_stack_fffffffffffffe40);
  std::unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>::get
            ((unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_> *)
             in_stack_fffffffffffffe40);
  predict_iforest((double *)&stack0xfffffffffffffe38,in_stack_00000018,(bool)in_stack_00000010._7_1_
                  ,(size_t)in_R8,(size_t)in_RCX,(double *)CONCAT44(uVar5,in_stack_fffffffffffffed8),
                  in_stack_ffffffffffffff40,Xc_indptr_00,in_RSI,in_stack_ffffffffffffff58,
                  in_stack_ffffffffffffff60,in_stack_ffffffffffffff68,in_stack_ffffffffffffff70,
                  SUB81((ulong)in_stack_00000020 >> 0x38,0),(IsoForest *)in_stack_ffffffffffffff80,
                  (ExtIsoForest *)in_stack_ffffffffffffff88._M_current,
                  (double *)in_stack_ffffffffffffff90._M_current,(size_t *)in_stack_ffffffffffffff98
                  ,(double *)CONCAT17(bVar3,in_stack_ffffffffffffffa0),indexer_00);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::reset
            (in_stack_00000028,in_stack_00000020);
  for (uVar7 = 0; uVar7 < sVar6; uVar7 = uVar7 + 1) {
    std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>::operator[](in_RDI,uVar7);
    std::unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>::get
              ((unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_> *)
               in_stack_00000028);
    std::unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>::get
              ((unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_> *)
               in_stack_00000028);
    std::vector<unsigned_long,std::allocator<unsigned_long>>::assign<unsigned_long*,void>
              (in_stack_00000038,in_stack_00000030,(unsigned_long *)in_stack_00000028);
    std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>::operator[](in_RDI,uVar7);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::shrink_to_fit
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x4452cc);
    std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>::operator[](in_RDI,uVar7);
    build_ref_node(in_RCX);
  }
  std::unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>::~unique_ptr
            ((unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_> *)in_stack_00000028
            );
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr(in_stack_00000028);
  return;
}

Assistant:

void set_reference_points(TreesIndexer &indexer, Model &model, const bool with_distances,
                          real_t *restrict numeric_data, int *restrict categ_data,
                          bool is_col_major, size_t ld_numeric, size_t ld_categ,
                          real_t *restrict Xc, sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr,
                          real_t *restrict Xr, sparse_ix *restrict Xr_ind, sparse_ix *restrict Xr_indptr,
                          size_t nrows, int nthreads)
{
    if (indexer.indices.empty() || (with_distances && indexer.indices.front().node_distances.empty()))
    {
        build_tree_indices(indexer, model, nthreads, with_distances);
    }

    if (!indexer.indices.front().reference_points.empty())
    {
        for (auto &tree : indexer.indices)
        {
            tree.reference_points.clear();
            tree.reference_indptr.clear();
            tree.reference_mapping.clear();
        }
    }


    size_t ntrees = get_ntrees(model);
    std::unique_ptr<double[]> ignored(new double[nrows]);
    std::unique_ptr<sparse_ix[]> node_indices_predict(new sparse_ix[nrows * ntrees]);
    void *model_ptr = (std::is_same<Model, IsoForest>::value)? &model : NULL;
    void *model_ext_ptr = (std::is_same<Model, ExtIsoForest>::value)? &model : NULL;
    predict_iforest(numeric_data, categ_data,
                    is_col_major, ld_numeric, ld_categ,
                    Xc, Xc_ind, Xc_indptr,
                    Xr, Xr_ind, Xr_indptr,
                    nrows, nthreads, false,
                    (IsoForest*)model_ptr, (ExtIsoForest*)model_ext_ptr,
                    ignored.get(), node_indices_predict.get(),
                    (double*)NULL,
                    &indexer);
    ignored.reset();

    #pragma omp parallel for schedule(dynamic) num_threads(nthreads) \
            shared(indexer, node_indices_predict, ntrees)
    for (size_t_for tree = 0; tree < (decltype(tree))ntrees; tree++)
    {
        indexer.indices[tree].reference_points.assign(node_indices_predict.get() + tree*nrows,
                                                      node_indices_predict.get() + (tree+1)*nrows);
        indexer.indices[tree].reference_points.shrink_to_fit();
        build_ref_node(indexer.indices[tree]);
    }
}